

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Timing::GetRunningEventDurations(Timing *this,string *id)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  pointer ppVar4;
  pointer pTVar5;
  string *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  const_iterator j;
  vector<Timing::Times,_std::allocator<Timing::Times>_> *times;
  stringstream ss;
  const_iterator it;
  vector<double,_std::allocator<double>_> *durations;
  string *in_stack_fffffffffffffda8;
  Timing *in_stack_fffffffffffffdb0;
  Timing *in_stack_fffffffffffffdc0;
  __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
  local_200;
  vector<Timing::Times,_std::allocator<Timing::Times>_> *local_1f8;
  undefined1 local_1e9;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  _Self local_40 [3];
  _Self local_28;
  undefined1 local_19;
  string *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9fc826);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
               *)in_stack_fffffffffffffda8,(key_type *)0x9fc838);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
              *)in_stack_fffffffffffffda8);
  bVar1 = std::operator==(&local_28,local_40);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar2 = std::operator<<(local_1b8,"Timing::GetRunningEventDurations No events called \"");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,"\" have been stored");
    local_1e9 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    E::E((E *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_1e9 = 0;
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>
                         *)0x9fc9c4);
  local_1f8 = &ppVar4->second;
  local_200._M_current =
       (Times *)std::vector<Timing::Times,_std::allocator<Timing::Times>_>::begin
                          ((vector<Timing::Times,_std::allocator<Timing::Times>_> *)
                           in_stack_fffffffffffffda8);
  while( true ) {
    std::vector<Timing::Times,_std::allocator<Timing::Times>_>::end
              ((vector<Timing::Times,_std::allocator<Timing::Times>_> *)in_stack_fffffffffffffda8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                        *)in_stack_fffffffffffffdb0,
                       (__normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
                        *)in_stack_fffffffffffffda8);
    if (!bVar1) break;
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
             ::operator->(&local_200);
    if ((pTVar5->hasEnded & 1U) == 0) {
      in_stack_fffffffffffffdb0 = (Timing *)GetCpuTime(in_stack_fffffffffffffdc0);
      __gnu_cxx::
      __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
      ::operator->(&local_200);
      ClockToSeconds(in_stack_fffffffffffffdb0,(clock_t)in_stack_fffffffffffffda8);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
                 (value_type_conflict3 *)in_stack_fffffffffffffda8);
    }
    __gnu_cxx::
    __normal_iterator<const_Timing::Times_*,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>
    ::operator++(&local_200);
  }
  return in_RDI;
}

Assistant:

vector<double> Timing::GetRunningEventDurations(const std::string & id) const
{
    vector<double> durations;

    map <string, vector<Times> >::const_iterator it=_m_timesMap.find(id);
    if(it==_m_timesMap.end())
    {
        stringstream ss;
        ss << "Timing::GetRunningEventDurations No events called \""
           << id << "\" have been stored";
        throw(E(ss.str()));
    }
    else
    {
        const vector<Times> &times=it->second;
        for(vector<Times>::const_iterator j=times.begin();
            j!=times.end();++j)
        {
            // here we are only interested in events that are still running
            if(!j->hasEnded)
                durations.push_back(ClockToSeconds(GetCpuTime() - j->start));
        }
    }
    return(durations);
}